

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_hlc.c
# Opt level: O2

TA_RetCode
do_call(TA_Test_conflict10 *test,double *high,double *low,double *close,int *outBegIdx,
       int *outNbElement,double *output)

{
  int startIdx;
  int endIdx;
  TA_RetCode TVar1;
  double *outRealUpperBand;
  double *outRealLowerBand;
  size_t __size;
  
  switch(test->theFunction) {
  case TA_ANY_MA_TEST:
    TVar1 = TA_CCI(test->startIdx,test->endIdx,high,low,close,test->optInTimePeriod1,outBegIdx,
                   outNbElement,output);
    break;
  case TA_AD_TEST:
    TVar1 = TA_WILLR(test->startIdx,test->endIdx,high,low,close,test->optInTimePeriod1,outBegIdx,
                     outNbElement,output);
    break;
  case TA_ADOSC_3_10_TEST:
    TVar1 = TA_ULTOSC(test->startIdx,test->endIdx,high,low,close,test->optInTimePeriod1,
                      test->optInTimePeriod2,test->optInTimePeriod3,outBegIdx,outNbElement,output);
    break;
  case TA_ADOSC_5_2_TEST:
    TVar1 = TA_NATR(test->startIdx,test->endIdx,high,low,close,test->optInTimePeriod1,outBegIdx,
                    outNbElement,output);
    break;
  case TA_ACCBANDS_TEST:
    startIdx = test->startIdx;
    endIdx = test->endIdx;
    __size = (long)((endIdx - startIdx) + 1) << 3;
    outRealUpperBand = (double *)malloc(__size);
    TVar1 = TA_ALLOC_ERR;
    if (outRealUpperBand == (double *)0x0) {
      return TA_ALLOC_ERR;
    }
    outRealLowerBand = (double *)malloc(__size);
    if (outRealLowerBand == (double *)0x0) goto LAB_0011902d;
    TVar1 = TA_ACCBANDS(startIdx,endIdx,high,low,close,test->optInTimePeriod1,outBegIdx,outNbElement
                        ,outRealUpperBand,output,outRealLowerBand);
    goto LAB_00119022;
  default:
    TVar1 = 0x140d;
  }
  outRealLowerBand = (double *)0x0;
  outRealUpperBand = (double *)0x0;
LAB_00119022:
  free(outRealUpperBand);
  outRealUpperBand = outRealLowerBand;
LAB_0011902d:
  free(outRealUpperBand);
  return TVar1;
}

Assistant:

static TA_RetCode do_call( const TA_Test *test,
                            const double high[],
                            const double low[],
                            const double close[],
                            int *outBegIdx,
                            int *outNbElement,
                            double output[] )
{
   TA_RetCode retCode;
   TA_Real *dummyBuffer1, *dummyBuffer2;

   if( test->theFunction != TA_ACCBANDS_TEST )
   {
	   dummyBuffer1 = NULL;
	   dummyBuffer2 = NULL;
   }
   else
   {
	   dummyBuffer1 = TA_Malloc( ((test->endIdx-test->startIdx)+1)*sizeof(TA_Real));
	   if( !dummyBuffer1 )
		 return TA_ALLOC_ERR;

	   dummyBuffer2 = TA_Malloc( ((test->endIdx-test->startIdx)+1)*sizeof(TA_Real));
	   if( !dummyBuffer2 )
	   {
		  TA_Free( dummyBuffer1 );
		  return TA_ALLOC_ERR;
	   }
   }

   switch( test->theFunction )
   {
   case TA_NATR_TEST:
      retCode = TA_NATR( test->startIdx,
                         test->endIdx,
                         high, low, close,
                         test->optInTimePeriod1,
                         outBegIdx,
                         outNbElement,
                         output );
      break;

   case TA_CCI_TEST:
      retCode = TA_CCI( test->startIdx,
                        test->endIdx,
                        high, low, close,
                        test->optInTimePeriod1,
                        outBegIdx,
                        outNbElement,
                        output );
      break;

   case TA_WILLR_TEST:
      retCode = TA_WILLR( test->startIdx,
                          test->endIdx,
                          high, low, close,
                          test->optInTimePeriod1,
                          outBegIdx,
                          outNbElement,
                          output );
      break;

   case TA_ULTOSC_TEST:
      retCode = TA_ULTOSC( test->startIdx,
                           test->endIdx,
                           high, low, close,
                           test->optInTimePeriod1,
                           test->optInTimePeriod2,
                           test->optInTimePeriod3,
                           outBegIdx,
                           outNbElement,
                           output );
      break;

   case TA_ACCBANDS_TEST:
	   /* TODO: replace dummy with real for more complete tests. */
      retCode = TA_ACCBANDS( test->startIdx,
                          test->endIdx,
                          high, low, close,
                          test->optInTimePeriod1,
                          outBegIdx,
                          outNbElement,
                          dummyBuffer1, output, dummyBuffer2 );
      break;

   default:
      retCode = TA_INTERNAL_ERROR(133);
   }

   FREE_IF_NOT_NULL( dummyBuffer1 );
   FREE_IF_NOT_NULL( dummyBuffer2 );

   return retCode;
}